

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

Vec_Ptr_t * Saig_ManBmcTerSim(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  uint *pInfo;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong local_40;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  local_40 = 100;
  uVar6 = 0;
  pInfo = (uint *)0x0;
  lVar7 = 0;
  iVar5 = 1000000000;
  do {
    iVar1 = Saig_ManBmcTerSimCount01(p,pInfo);
    pInfo = Saig_ManBmcTerSimOne(p,pInfo);
    iVar4 = (int)local_40;
    if ((int)lVar7 == iVar4) {
      if (iVar4 < 0x10) {
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
        }
        pVVar2->pArray = ppvVar3;
        pVVar2->nCap = 0x10;
        local_40 = 0x10;
      }
      else {
        local_40 = (ulong)(uint)(iVar4 * 2);
        if (pVVar2->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(local_40 * 8);
        }
        else {
          ppvVar3 = (void **)realloc(pVVar2->pArray,local_40 * 8);
        }
        pVVar2->pArray = ppvVar3;
        pVVar2->nCap = iVar4 * 2;
      }
    }
    else {
      ppvVar3 = pVVar2->pArray;
    }
    iVar4 = (int)(lVar7 + 1);
    pVVar2->nSize = iVar4;
    ppvVar3[lVar7] = pInfo;
  } while (((0 < iVar1) && (iVar4 - 1U < 999)) &&
          (uVar6 = uVar6 + (iVar5 <= iVar1), lVar7 = lVar7 + 1, iVar5 = iVar1, uVar6 < 5));
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcTerSim( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    unsigned * pInfo = NULL;
    int i, TerPrev = ABC_INFINITY, TerCur, CountIncrease = 0;
    vInfos = Vec_PtrAlloc( 100 );
    for ( i = 0; i < 1000 && CountIncrease < 5 && TerPrev > 0; i++ )
    {
        TerCur = Saig_ManBmcTerSimCount01( p, pInfo );
        if ( TerCur >= TerPrev )
            CountIncrease++;
        TerPrev = TerCur;
        pInfo = Saig_ManBmcTerSimOne( p, pInfo );
        Vec_PtrPush( vInfos, pInfo );
    }
    return vInfos;
}